

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O2

SVInt __thiscall
slang::ast::UnbasedUnsizedIntegerLiteral::getValue(UnbasedUnsizedIntegerLiteral *this)

{
  char cVar1;
  bool isSigned;
  bitwidth_t bitWidth;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long in_RSI;
  SVInt SVar3;
  undefined8 uVar2;
  
  bitWidth = Type::getBitWidth(*(Type **)(in_RSI + 8));
  isSigned = Type::isSigned(*(Type **)(in_RSI + 8));
  cVar1 = *(char *)(in_RSI + 0x30);
  if (cVar1 == -0x80) {
    SVar3 = SVInt::createFillX((SVInt *)this,bitWidth,isSigned);
    uVar2 = SVar3.super_SVIntStorage._8_8_;
  }
  else if (cVar1 == '\x01') {
    SVInt::SVInt((SVInt *)this,bitWidth,0,isSigned);
    SVInt::setAllOnes((SVInt *)this);
    uVar2 = extraout_RDX;
  }
  else if (cVar1 == '@') {
    SVar3 = SVInt::createFillZ((SVInt *)this,bitWidth,isSigned);
    uVar2 = SVar3.super_SVIntStorage._8_8_;
  }
  else {
    SVInt::SVInt((SVInt *)this,bitWidth,0,isSigned);
    uVar2 = extraout_RDX_00;
  }
  SVar3.super_SVIntStorage.bitWidth = (int)uVar2;
  SVar3.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar2 >> 0x20);
  SVar3.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar2 >> 0x28);
  SVar3.super_SVIntStorage._14_2_ = (short)((ulong)uVar2 >> 0x30);
  SVar3.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar3.super_SVIntStorage;
}

Assistant:

SVInt UnbasedUnsizedIntegerLiteral::getValue() const {
    bitwidth_t width = type->getBitWidth();
    bool isSigned = type->isSigned();

    switch (value.value) {
        case 0:
            return SVInt(width, 0, isSigned);
        case 1: {
            SVInt tmp(width, 0, isSigned);
            tmp.setAllOnes();
            return tmp;
        }
        case logic_t::X_VALUE:
            return SVInt::createFillX(width, isSigned);
        case logic_t::Z_VALUE:
            return SVInt::createFillZ(width, isSigned);
        default:
            SLANG_UNREACHABLE;
    }
}